

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  string *psVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  istream *piVar5;
  ostream *poVar6;
  long lVar7;
  string *psVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar10;
  istringstream local_470 [8];
  istringstream f;
  ostream local_460 [376];
  undefined1 local_2e8 [8];
  stringstream ss;
  ostream local_2d8 [16];
  byte abStack_2c8 [488];
  undefined1 local_e0 [8];
  string filepath;
  string s;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  undefined1 local_68 [8];
  string filepath_1;
  allocator local_31;
  
  psVar1 = &this->m_mtlBaseDir;
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    psVar8 = warn;
    std::__cxx11::string::string((string *)local_68,(string *)matId);
    std::ifstream::ifstream(local_2e8,(char *)local_68,_S_in);
    bVar10 = (abStack_2c8[*(long *)((long)local_2e8 + -0x18)] & 5) == 0;
    if (bVar10) {
      LoadMtl(matMap,materials,(istream *)local_2e8,warn,psVar8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_470);
      poVar6 = std::operator<<(local_460,"Material file [ ");
      poVar6 = std::operator<<(poVar6,(string *)local_68);
      poVar6 = std::operator<<(poVar6," ] not found in a path : ");
      poVar6 = std::operator<<(poVar6,(string *)psVar1);
      std::endl<char,std::char_traits<char>>(poVar6);
      if (warn != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)warn);
        std::__cxx11::string::~string((string *)(filepath.field_2._M_local_buf + 8));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_470);
    }
    std::ifstream::~ifstream(local_2e8);
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    auStack_88 = (undefined1  [8])0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar8 = warn;
    s.field_2._8_8_ = psVar1;
    std::__cxx11::istringstream::istringstream(local_470,(string *)psVar1,_S_in);
    filepath.field_2._8_8_ = &s._M_string_length;
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length._0_1_ = 0;
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_470,(string *)(filepath.field_2._M_local_buf + 8),':');
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_88,(value_type *)(filepath.field_2._M_local_buf + 8));
    }
    lVar7 = 0;
    uVar9 = 0;
    filepath_1.field_2._8_8_ = warn;
    while( true ) {
      bVar10 = uVar9 < (ulong)((long)paths.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >>
                              5);
      if (!bVar10) break;
      lVar2 = *(long *)((long)((long)auStack_88 + 8) + lVar7);
      if (lVar2 == 0) {
        std::__cxx11::string::string((string *)local_e0,(string *)matId);
      }
      else {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&((_Alloc_hider *)auStack_88)->_M_p + lVar7);
        if ((__lhs->_M_dataplus)._M_p[lVar2 + -1] == '/') {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,__lhs,matId);
        }
        else {
          std::__cxx11::string::string((string *)local_68,"/",&local_31);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8,__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2e8,matId);
          std::__cxx11::string::~string((string *)local_2e8);
          std::__cxx11::string::~string((string *)local_68);
        }
      }
      std::ifstream::ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 (char *)local_e0,_S_in);
      if ((abStack_2c8[*(long *)((long)local_2e8 + -0x18)] & 5) == 0) {
        LoadMtl(matMap,materials,(istream *)local_2e8,(string *)filepath_1.field_2._8_8_,psVar8);
        std::ifstream::~ifstream(local_2e8);
        std::__cxx11::string::~string((string *)local_e0);
        goto LAB_001117ef;
      }
      std::ifstream::~ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      std::__cxx11::string::~string((string *)local_e0);
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x20;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_2e8);
    poVar6 = std::operator<<(local_2d8,"Material file [ ");
    uVar4 = filepath_1.field_2._8_8_;
    uVar3 = s.field_2._8_8_;
    poVar6 = std::operator<<(poVar6,(string *)matId);
    poVar6 = std::operator<<(poVar6," ] not found in a path : ");
    poVar6 = std::operator<<(poVar6,(string *)uVar3);
    std::endl<char,std::char_traits<char>>(poVar6);
    if (uVar4 != 0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)uVar4);
      std::__cxx11::string::~string((string *)local_68);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2e8);
LAB_001117ef:
    std::__cxx11::string::~string((string *)(filepath.field_2._M_local_buf + 8));
    std::__cxx11::istringstream::~istringstream(local_470);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_88);
  }
  return bVar10;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}